

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::detail::storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
::destruct_value(storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *this)

{
  value_type *this_00;
  storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *this_local;
  
  this_00 = value_ptr(this);
  std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::~pair(this_00);
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }